

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<float>::SwapElements
          (RepeatedFieldWrapper<float> *this,Field *data,int index1,int index2)

{
  RepeatedField<float> *this_00;
  int index2_local;
  int index1_local;
  Field *data_local;
  RepeatedFieldWrapper<float> *this_local;
  
  this_00 = (RepeatedField<float> *)(**(code **)(*(long *)this + 0x88))(this,data);
  RepeatedField<float>::SwapElements(this_00,index1,index2);
  return;
}

Assistant:

void SwapElements(Field* data, int index1, int index2) const override {
    MutableRepeatedField(data)->SwapElements(index1, index2);
  }